

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O3

void __thiscall deqp::SubcaseBase::OutputNotSupported(SubcaseBase *this,string *reason)

{
  TestLog *this_00;
  pointer pcVar1;
  char cVar2;
  istream *piVar3;
  string msg;
  string line;
  istringstream tokens;
  long *local_1e8 [2];
  long local_1d8 [2];
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  long local_1a8 [15];
  ios_base local_130 [264];
  
  this_00 = ((this->super_GLWrapper).m_context)->m_testCtx->m_log;
  pcVar1 = (reason->_M_dataplus)._M_p;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar1,pcVar1 + reason->_M_string_length);
  std::__cxx11::string::append((char *)local_1e8);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a8,(string *)local_1e8,_S_in);
  local_1c0 = 0;
  local_1b8 = '\0';
  local_1c8 = &local_1b8;
  tcu::TestLog::startSection(this_00,"Not supported","Reason");
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) +
                            (char)(istringstream *)local_1a8);
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,cVar2);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    tcu::TestLog::writeMessage(this_00,local_1c8);
  }
  tcu::TestLog::endSection(this_00);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
  std::ios_base::~ios_base(local_130);
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  return;
}

Assistant:

void SubcaseBase::OutputNotSupported(std::string reason)
{
	using tcu::TestLog;
	TestLog&		   log = m_context.getTestContext().getLog();
	std::string		   msg = reason + ", test will not run.";
	std::istringstream tokens(msg);
	std::string		   line;
	log.startSection("Not supported", "Reason");
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}